

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aflatin.c
# Opt level: O0

void af_latin_metrics_check_digits(AF_LatinMetrics metrics,FT_Face face)

{
  uint local_6c;
  FT_ULong FStack_68;
  uint num_idx;
  FT_ULong glyph_index;
  char *p;
  char digits [20];
  void *shaper_buf;
  FT_ULong shaper_buf_;
  FT_Fixed old_advance;
  FT_Fixed advance;
  FT_Bool same_width;
  FT_Face pFStack_18;
  FT_Bool started;
  FT_Face face_local;
  AF_LatinMetrics metrics_local;
  
  advance._7_1_ = '\0';
  advance._6_1_ = 1;
  old_advance = 0;
  shaper_buf_ = 0;
  unique0x00004780 = &shaper_buf;
  p = (char *)0x2033203220312030;
  builtin_strncpy(digits,"4 5 6 7 8 9",0xc);
  glyph_index = (FT_ULong)&p;
  pFStack_18 = face;
  face_local = (FT_Face)metrics;
  do {
    while( true ) {
      do {
        if (*(char *)glyph_index == '\0') goto LAB_00371c8c;
        glyph_index = (FT_ULong)
                      af_shaper_get_cluster
                                ((char *)glyph_index,(AF_StyleMetrics_conflict)face_local,
                                 stack0xffffffffffffffc0,&local_6c);
      } while ((1 < local_6c) ||
              (FStack_68 = af_shaper_get_elem((AF_StyleMetrics_conflict)face_local,
                                              stack0xffffffffffffffc0,0,&old_advance,(FT_Long *)0x0)
              , FStack_68 == 0));
      if (advance._7_1_ != '\0') break;
      shaper_buf_ = old_advance;
      advance._7_1_ = '\x01';
    }
  } while (old_advance == shaper_buf_);
  advance._6_1_ = 0;
LAB_00371c8c:
  af_shaper_buf_destroy(pFStack_18,stack0xffffffffffffffc0);
  *(undefined1 *)&face_local->num_fixed_sizes = advance._6_1_;
  return;
}

Assistant:

FT_LOCAL_DEF( void )
  af_latin_metrics_check_digits( AF_LatinMetrics  metrics,
                                 FT_Face          face )
  {
    FT_Bool   started = 0, same_width = 1;
    FT_Fixed  advance = 0, old_advance = 0;

    /* If HarfBuzz is not available, we need a pointer to a single */
    /* unsigned long value.                                        */
#ifdef FT_CONFIG_OPTION_USE_HARFBUZZ
    void*     shaper_buf;
#else
    FT_ULong  shaper_buf_;
    void*     shaper_buf = &shaper_buf_;
#endif

    /* in all supported charmaps, digits have character codes 0x30-0x39 */
    const char   digits[] = "0 1 2 3 4 5 6 7 8 9";
    const char*  p;


    p = digits;

#ifdef FT_CONFIG_OPTION_USE_HARFBUZZ
    shaper_buf = af_shaper_buf_create( face );
#endif

    while ( *p )
    {
      FT_ULong      glyph_index;
      unsigned int  num_idx;


      /* reject input that maps to more than a single glyph */
      p = af_shaper_get_cluster( p, &metrics->root, shaper_buf, &num_idx );
      if ( num_idx > 1 )
        continue;

      glyph_index = af_shaper_get_elem( &metrics->root,
                                        shaper_buf,
                                        0,
                                        &advance,
                                        NULL );
      if ( !glyph_index )
        continue;

      if ( started )
      {
        if ( advance != old_advance )
        {
          same_width = 0;
          break;
        }
      }
      else
      {
        old_advance = advance;
        started     = 1;
      }
    }

    af_shaper_buf_destroy( face, shaper_buf );

    metrics->root.digits_have_same_width = same_width;
  }